

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * get_driver(string *__return_storage_ptr__,string *tty)

{
  pointer pcVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  char local_4d8 [8];
  char buffer [1024];
  stat st;
  string devicedir;
  
  pcVar1 = (tty->_M_dataplus)._M_p;
  st.__glibc_reserved[2] = (__syscall_slong_t)&devicedir._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(st.__glibc_reserved + 2),pcVar1,pcVar1 + tty->_M_string_length);
  std::__cxx11::string::append((char *)(st.__glibc_reserved + 2));
  iVar2 = lstat((char *)st.__glibc_reserved[2],(stat *)(buffer + 0x3f8));
  if ((iVar2 == 0) && (((uint)st.st_nlink & 0xf000) == 0xa000)) {
    memset(local_4d8,0,0x400);
    std::__cxx11::string::append((char *)(st.__glibc_reserved + 2));
    sVar3 = readlink((char *)st.__glibc_reserved[2],local_4d8,0x400);
    if (0 < sVar3) {
      pcVar4 = basename(local_4d8);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,pcVar4,
                 (allocator *)(devicedir.field_2._M_local_buf + 0xf));
      goto LAB_00103410;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00103410:
  if ((size_type *)st.__glibc_reserved[2] != &devicedir._M_string_length) {
    operator_delete((void *)st.__glibc_reserved[2]);
  }
  return __return_storage_ptr__;
}

Assistant:

string get_driver(const string& tty) {
    struct stat st;
    string devicedir = tty;

    // Append '/device' to the tty-path
    devicedir += "/device";

    // Stat the devicedir and handle it if it is a symlink
    if (lstat(devicedir.c_str(), &st)==0 && S_ISLNK(st.st_mode)) {
        char buffer[1024];
        memset(buffer, 0, sizeof(buffer));

        // Append '/driver' and return basename of the target
        devicedir += "/driver";

        if (readlink(devicedir.c_str(), buffer, sizeof(buffer)) > 0)
            return basename(buffer);
    }
    return "";
}